

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestContext::TestContext(TestContext *this)

{
  TestNetwork *this_00;
  Server *pSVar1;
  long *plVar2;
  Vat *pVVar3;
  StringPtr name;
  StringPtr name_00;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  Disposer *local_58;
  Server *local_50;
  Own<capnp::Capability::Server,_std::nullptr_t> local_48;
  undefined1 local_38 [8];
  undefined8 *local_30;
  long *local_28;
  
  kj::EventLoop::EventLoop(&this->loop);
  (this->waitScope).loop = &this->loop;
  (this->waitScope).busyPollInterval = 0xffffffff;
  (this->waitScope).fiber.ptr = (FiberBase *)0x0;
  (this->waitScope).runningStacksPool.ptr = (FiberPool *)0x0;
  kj::EventLoop::enterScope(&this->loop);
  this_00 = &this->network;
  (this->network).dumper.schemas.table.rows.builder.ptr = (Entry *)0x0;
  (this->network).dumper.schemas.table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
  (this->network).dumper.schemas.table.rows.builder.endPtr = (Entry *)0x0;
  (this->network).dumper.schemas.table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->network).forwardCount = 0;
  (this->network).deniedForwardCount = 0;
  (this->network).map.table.rows.builder.ptr = (Entry *)0x0;
  (this->network).map.table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
        *)0x0;
  (this->network).map.table.rows.builder.endPtr = (Entry *)0x0;
  (this->network).dumper.schemas.table.indexes.erasedCount = 0;
  (this->network).dumper.schemas.table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->network).dumper.schemas.table.indexes.buckets.size_ = 0;
  (this->network).dumper.schemas.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->network).forwardingEnabled = false;
  (this->network).map.table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->network).map.table.indexes.erasedCount = 0;
  (this->network).map.table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->network).map.table.indexes.buckets.size_ = 0;
  (this->network).map.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->network).tokenCounter = 0;
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6c3918);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6c40f8);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6c4448);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6c4a08);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6c4b98);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6c4d38);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6c5290);
  (this->restorer).callCount = 0;
  (this->restorer).handleCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&,int&>
            ((kj *)&local_58,&(this->restorer).callCount,&(this->restorer).handleCount);
  local_48.disposer = local_58;
  local_48.ptr = local_50;
  if (local_50 != (Server *)0x0) {
    local_48.ptr = (Server *)&local_50[1].thisHook;
  }
  local_50 = (Server *)0x0;
  OVar4 = Capability::Client::makeLocalClient((Client *)&(this->restorer).cap.field_0x8,&local_48);
  pSVar1 = local_48.ptr;
  if (local_48.ptr != (Server *)0x0) {
    local_48.ptr = (Server *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,
               (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]),OVar4.ptr
              );
  }
  pSVar1 = local_50;
  (this->restorer).cap._vptr_Client = (_func_int **)&Capability::Client::typeinfo;
  if (local_50 != (Server *)0x0) {
    local_50 = (Server *)0x0;
    (**local_58->_vptr_Disposer)(local_58,(long)pSVar1 + *(long *)(*(long *)pSVar1 + -0x10));
  }
  (this->vats).table.rows.builder.ptr = (Entry *)0x0;
  (this->vats).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat>_>::Entry>
        *)0x0;
  (this->vats).table.rows.builder.endPtr = (Entry *)0x0;
  (this->vats).table.rows.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->vats).table.indexes.erasedCount = 0;
  (this->vats).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->vats).table.indexes.buckets.size_ = 0;
  (this->vats).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  name.content.size_ = 6;
  name.content.ptr = "alice";
  pVVar3 = getVat(this,name);
  this->alice = pVVar3;
  (**(code **)(**(long **)(&(this->restorer).cap.field_0x8 +
                          (long)(this->restorer).cap._vptr_Client[-3]) + 0x20))(&local_30);
  local_38 = (undefined1  [8])&Capability::Client::typeinfo;
  name_00.content.size_ = 4;
  name_00.content.ptr = "bob";
  pVVar3 = initVat<capnproto_test::capnp::test::TestInterface::Client>
                     (this,name_00,(Client *)local_38);
  plVar2 = local_28;
  if (local_28 != (long *)0x0) {
    local_28 = (long *)0x0;
    (**(code **)*local_30)(local_30,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  this->bob = pVVar3;
  return;
}

Assistant:

TestContext()
      : waitScope(loop),
        alice(getVat("alice")),
        bob(initVat("bob", restorer.cap)) {}